

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Material>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Material *material
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  string *psVar12;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_2f8;
  undefined1 local_2d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c0;
  string *local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_250;
  TypedConnection<tinyusdz::Token> *local_248;
  TypedConnection<tinyusdz::Token> *local_240;
  TypedConnection<tinyusdz::Token> *local_238;
  _Base_ptr local_230;
  string local_228;
  string local_208;
  string local_1e8;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  undefined1 local_1a8 [16];
  code *local_198;
  code *pcStack_190;
  ios_base local_138 [264];
  
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_230 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_2b0 = warn;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var11 == local_230) {
    bVar5 = true;
  }
  else {
    local_238 = &material->surface;
    local_240 = &material->displacement;
    local_248 = &material->volume;
    local_250 = &(material->super_UsdShadePrim).props;
    local_288 = &(material->super_UsdShadePrim).purpose;
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,*(long *)(p_Var11 + 1),
                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
      prop = (Property *)(p_Var11 + 2);
      local_1a8._0_8_ = &local_198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"outputs:surface","");
      psVar12 = (string *)local_1a8;
      anon_unknown_0::ParseShaderInputConnectionProperty
                ((ParseResult *)local_2d8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_280,&local_1e8,prop,(string *)local_1a8,local_238);
      if ((code **)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      iVar6 = 0;
      if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
        iVar6 = 3;
LAB_00254e08:
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if (local_2d8._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x1314);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          local_2a8[0] = local_298;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a8,"Parsing shader property `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    (&local_2f8,(fmt *)local_2a8,(string *)"outputs:surface",
                     (char (*) [16])(local_2d8 + 8),psVar12);
          poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                              local_2f8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (local_2a8[0] != local_298) {
            operator_delete(local_2a8[0],local_298[0] + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar8 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_2f8.field_2._M_allocated_capacity = *psVar1;
              local_2f8.field_2._8_8_ = plVar8[3];
              local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            }
            else {
              local_2f8.field_2._M_allocated_capacity = *psVar1;
              local_2f8._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_2f8._M_string_length = plVar8[1];
            *plVar8 = (long)psVar1;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          iVar6 = 1;
          goto LAB_00254e08;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._8_8_ != &aStack_2c0) {
        operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
      }
      if (bVar5) {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"outputs:displacement","");
        psVar12 = (string *)local_1a8;
        anon_unknown_0::ParseShaderInputConnectionProperty
                  ((ParseResult *)local_2d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_280,&local_208,prop,(string *)local_1a8,local_240);
        if ((code **)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_00255109:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_2d8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x1316);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_2a8[0] = local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Parsing shader property `{}` failed. Error: {}","");
            fmt::format<char[21],std::__cxx11::string>
                      (&local_2f8,(fmt *)local_2a8,(string *)"outputs:displacement",
                       (char (*) [21])(local_2d8 + 8),psVar12);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                                local_2f8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8.field_2._8_8_ = plVar8[3];
                local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
              }
              else {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2f8._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar6 = 1;
            goto LAB_00255109;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._8_8_ != &aStack_2c0) {
          operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_00255b23;
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"outputs:volume","");
        psVar12 = (string *)local_1a8;
        anon_unknown_0::ParseShaderInputConnectionProperty
                  ((ParseResult *)local_2d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_280,&local_228,prop,(string *)local_1a8,local_248);
        if ((code **)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_0025540a:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_2d8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x1318);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_2a8[0] = local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Parsing shader property `{}` failed. Error: {}","");
            fmt::format<char[15],std::__cxx11::string>
                      (&local_2f8,(fmt *)local_2a8,(string *)"outputs:volume",
                       (char (*) [15])(local_2d8 + 8),psVar12);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                                local_2f8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8.field_2._8_8_ = plVar8[3];
                local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
              }
              else {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2f8._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar6 = 1;
            goto LAB_0025540a;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._8_8_ != &aStack_2c0) {
          operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_00255b23;
        __k = p_Var11 + 1;
        iVar6 = ::std::__cxx11::string::compare((char *)__k);
        if (iVar6 == 0) {
          local_1a8._0_8_ = &local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"purpose","");
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_280,(string *)local_1a8);
          if ((code **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
          }
          if ((_Rb_tree_header *)cVar9._M_node == &local_280._M_impl.super__Rb_tree_header) {
            if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
              Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)prop);
              local_2d8._0_8_ = local_2d8 + 0x10;
              local_2d8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x5;
              local_2d8._16_6_ = 0x6e656b6f74;
              if (((local_1a8._8_8_ == 5) &&
                  ((char)*(int *)(local_1a8._0_8_ + 4) == 'n' &&
                   *(int *)local_1a8._0_8_ == 0x656b6f74)) &&
                 (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                if ((code **)local_1a8._0_8_ != &local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
                if (uVar4 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x131a);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"purpose",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                  if (local_2b0 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar8 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)&local_2f8,(ulong)(err->_M_dataplus)._M_p);
                    psVar1 = (size_type *)(plVar8 + 2);
                    if ((size_type *)*plVar8 == psVar1) {
                      local_2d8._16_8_ = *psVar1;
                      aStack_2c0._M_allocated_capacity = plVar8[3];
                      local_2d8._0_8_ = local_2d8 + 0x10;
                    }
                    else {
                      local_2d8._16_8_ = *psVar1;
                      local_2d8._0_8_ = (size_type *)*plVar8;
                    }
                    local_2d8._8_8_ = plVar8[1];
                    *plVar8 = (long)psVar1;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
                    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                      operator_delete(local_2f8._M_dataplus._M_p,
                                      local_2f8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                  AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var11 + 7));
                  local_1a8._0_8_ = &local_198;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"purpose","");
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_280,(string *)local_1a8);
                  if ((code **)local_1a8._0_8_ != &local_198) {
                    operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                  }
                  goto LAB_00255b32;
                }
              }
              else if ((code **)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
              }
            }
            local_2d8._0_8_ = local_2d8 + 0x10;
            local_1a8._8_8_ = 0;
            local_1a8._0_8_ = PurposeEnumHandler;
            pcStack_190 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_invoke;
            local_198 = ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::_M_manager;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"purpose","");
            bVar5 = options->strict_allowedToken_check;
            local_1b8 = (code *)0x0;
            pcStack_1b0 = (code *)0x0;
            local_1c8._M_unused._M_object = (void *)0x0;
            local_1c8._8_8_ = 0;
            if (local_198 != (code *)0x0) {
              (*local_198)(&local_1c8,(string *)local_1a8,2);
              local_1b8 = local_198;
              pcStack_1b0 = pcStack_190;
            }
            bVar5 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                              ((string *)local_2d8,bVar5,
                               (EnumHandlerFun<tinyusdz::Purpose> *)&local_1c8,(Attribute *)prop,
                               local_288,local_2b0,err);
            if (local_1b8 != (code *)0x0) {
              (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
            }
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
            iVar6 = 1;
            if (bVar5) {
              AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var11 + 7));
              local_2d8._0_8_ = local_2d8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"purpose","");
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2d8);
              if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              iVar6 = 3;
            }
            if (local_198 != (code *)0x0) {
              (*local_198)((string *)local_1a8,(string *)local_1a8,3);
            }
            goto LAB_00255b23;
          }
        }
        else {
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_280,(key_type *)__k);
          p_Var3 = &local_280._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar9._M_node == p_Var3) {
            pmVar10 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_250,(key_type *)__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar10);
            (pmVar10->_attrib)._varying_authored = (bool)p_Var11[3].field_0x4;
            (pmVar10->_attrib)._variability = p_Var11[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar10->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar10->_attrib)._var,(any *)&p_Var11[4]._M_parent);
            (pmVar10->_attrib)._var._blocked = SUB41(p_Var11[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar10->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var11[5]._M_parent);
            (pmVar10->_attrib)._var._ts._dirty = SUB41(p_Var11[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar10->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var11[6]._M_parent);
            AttrMetas::operator=(&(pmVar10->_attrib)._metas,(AttrMetas *)(p_Var11 + 7));
            *(_Base_ptr *)&pmVar10->_listOpQual = p_Var11[0x17]._M_parent;
            (pmVar10->_rel).type = *(Type *)&p_Var11[0x17]._M_left;
            Path::operator=(&(pmVar10->_rel).targetPath,(Path *)&p_Var11[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar10->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var11[0x1e]._M_parent);
            (pmVar10->_rel).listOpQual = p_Var11[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar10->_rel)._metas,(AttrMetas *)&p_Var11[0x1f]._M_parent);
            (pmVar10->_rel)._varying_authored = *(bool *)&p_Var11[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar10->_prop_value_type_name);
            pmVar10->_has_custom = *(bool *)&p_Var11[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_280,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          }
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_280,(key_type *)__k);
          if ((_Rb_tree_header *)cVar9._M_node == p_Var3) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x131c);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2d8,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_2d8._0_8_,local_2d8._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            psVar1 = (size_type *)(local_2d8 + 0x10);
            if ((size_type *)local_2d8._0_8_ != psVar1) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
            if (local_2b0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)&local_2f8,(ulong)(err->_M_dataplus)._M_p);
              psVar2 = (size_type *)(plVar8 + 2);
              if ((size_type *)*plVar8 == psVar2) {
                local_2d8._16_8_ = *psVar2;
                aStack_2c0._M_allocated_capacity = plVar8[3];
                local_2d8._0_8_ = psVar1;
              }
              else {
                local_2d8._16_8_ = *psVar2;
                local_2d8._0_8_ = (size_type *)*plVar8;
              }
              local_2d8._8_8_ = plVar8[1];
              *plVar8 = (long)psVar2;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
              if ((size_type *)local_2d8._0_8_ != psVar1) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
          }
        }
      }
      else {
LAB_00255b23:
        if ((iVar6 != 3) && (iVar6 != 0)) {
          bVar5 = false;
          goto LAB_00255cd0;
        }
      }
LAB_00255b32:
      p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
    } while (p_Var11 != local_230);
    bVar5 = true;
  }
LAB_00255cd0:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_280,(_Link_type)local_280._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar5;
}

Assistant:

bool ReconstructPrim<Material>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Material *material,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;

  // TODO: special treatment for properties with 'inputs' and 'outputs' namespace.

  // For `Material`, `outputs` are terminal attribute and treated as input attribute with connection(Should be "token output:surface.connect = </path/to/shader>").
  for (auto &prop : properties) {
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:surface",
                                  Material, material->surface)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:displacement",
                                  Material, material->displacement)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:volume",
                                  Material, material->volume)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, Material,
                       material->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Material, material->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}